

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.h
# Opt level: O0

uint64_t quicly_decodev(uint8_t **src,uint8_t *end)

{
  byte *pbVar1;
  ulong uVar2;
  uint8_t **local_30;
  uint64_t v;
  size_t len;
  uint8_t *end_local;
  uint8_t **src_local;
  
  if (*src == end) {
    src_local = (uint8_t **)0xffffffffffffffff;
  }
  else if ((int)(uint)**src >> 6 == 0) {
    pbVar1 = *src;
    *src = pbVar1 + 1;
    src_local = (uint8_t **)(ulong)*pbVar1;
  }
  else {
    uVar2 = (ulong)(1 << (sbyte)((int)(uint)**src >> 6));
    if (((long)end - (long)*src < 0) || ((ulong)((long)end - (long)*src) < uVar2)) {
      src_local = (uint8_t **)0xffffffffffffffff;
    }
    else {
      pbVar1 = *src;
      *src = pbVar1 + 1;
      local_30 = (uint8_t **)(long)(int)(*pbVar1 & 0x3f);
      v = uVar2 - 1;
      do {
        pbVar1 = *src;
        *src = pbVar1 + 1;
        local_30 = (uint8_t **)((long)local_30 << 8 | (ulong)*pbVar1);
        v = v - 1;
        src_local = local_30;
      } while (v != 0);
    }
  }
  return (uint64_t)src_local;
}

Assistant:

inline uint64_t quicly_decodev(const uint8_t **src, const uint8_t *end)
{
    if (*src == end)
        return UINT64_MAX;
    if (**src >> 6 == 0)
        return *(*src)++;

    /* multi-byte */
    size_t len = 1 << (**src >> 6);
    if (end - *src < 0 || (size_t)(end - *src) < len)
        return UINT64_MAX;
    uint64_t v = *(*src)++ & 0x3f;
    --len;
    do {
        v = (v << 8) | *(*src)++;
    } while (--len != 0);
    return v;
}